

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * amrex::intersect(BoxArray *ba,Box *b,IntVect *ng)

{
  int iVar1;
  size_type sVar2;
  BoxArray *in_RDI;
  int i;
  int N;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray *r;
  IntVect *in_stack_00000598;
  undefined1 in_stack_000005a7;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
  *in_stack_000005a8;
  Box *in_stack_000005b0;
  BoxArray *in_stack_000005b8;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_50;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  BoxArray *in_stack_ffffffffffffffc8;
  
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x126e7d4);
  BoxArray::intersections
            (in_stack_000005b8,in_stack_000005b0,in_stack_000005a8,(bool)in_stack_000005a7,
             in_stack_00000598);
  sVar2 = std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          size((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               &stack0xffffffffffffffc8);
  iVar1 = (int)sVar2;
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
  if (0 < iVar1) {
    for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
      operator[]((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )&stack0xffffffffffffffc8,(long)local_50);
      BoxArray::set(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                    (Box *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    }
  }
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_RDI);
  return in_RDI;
}

Assistant:

BoxArray
intersect (const BoxArray& ba,
           const Box&      b,
           const IntVect&  ng)
{
    std::vector< std::pair<int,Box> > isects;

    ba.intersections(b,isects,false,ng);

    const int N = isects.size();

    BoxArray r(N);

    if (N > 0) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++)
        {
            r.set(i, isects[i].second);
        }
    }

    return r;
}